

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatecode.c
# Opt level: O2

void output_c_for_amode_ptr(Token *t,BOOL reversed)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  uint uVar6;
  size_t sStack_230;
  char buf [512];
  
  bVar1 = (t->u).reginfo.which;
  uVar3 = bVar1 & 7;
  bVar2 = (t->u).reginfo.size;
  switch(bVar1 >> 3 & 7) {
  default:
    pcVar5 = "Internal error: called output_c_for_amode_ptr with a register addressing mode!";
    goto LAB_0010d74c;
  case 2:
    fprintf((FILE *)syn68k_c_stream,"(ADDRESS_REGISTER_UL (%d)) ",(ulong)uVar3);
    return;
  case 3:
    fprintf((FILE *)syn68k_c_stream,"(ADDRESS_REGISTER_UL (%d)) ",(ulong)uVar3);
    if (uVar3 == 7 || bVar2 != 1) {
      uVar4 = 2;
      if (bVar2 != 1) {
        uVar4 = (ulong)bVar2;
      }
      if (uVar3 != 7) {
        uVar4 = (ulong)(uint)bVar2;
      }
      pcVar5 = "INC_VAR (ADDRESS_REGISTER_UL (%d), %d); ";
LAB_0010d7b1:
      sprintf(buf,pcVar5,(ulong)uVar3,uVar4);
      goto LAB_0010d7b8;
    }
    pcVar5 = "++ADDRESS_REGISTER_UL (%d); ";
    break;
  case 4:
    uVar6 = (uint)bVar2;
    uVar4 = 2;
    if (uVar6 != 1) {
      uVar4 = (ulong)uVar6;
    }
    if (uVar3 != 7) {
      uVar4 = (ulong)bVar2;
    }
    fprintf((FILE *)syn68k_c_stream,"(ADDRESS_REGISTER_UL (%d) - %d) ",(ulong)uVar3,uVar4);
    if (uVar3 == 7 || uVar6 != 1) {
      pcVar5 = "DEC_VAR (ADDRESS_REGISTER_UL (%d), %d); ";
      goto LAB_0010d7b1;
    }
    pcVar5 = "--ADDRESS_REGISTER_UL (%d); ";
    break;
  case 5:
    pcVar5 = 
    "Internal error: attempting to generate code for fixed amode 5.  It should have been expanded and replaced with explicit code to compute the pointer.\n"
    ;
LAB_0010d74c:
    fatal_error(pcVar5);
    return;
  case 6:
  case 7:
    if (reversed == FALSE) {
      pcVar5 = " (cpu_state.amode_p) ";
      sStack_230 = 0x15;
    }
    else {
      pcVar5 = " (cpu_state.reversed_amode_p) ";
      sStack_230 = 0x1e;
    }
    fwrite(pcVar5,sStack_230,1,(FILE *)syn68k_c_stream);
    return;
  }
  sprintf(buf,pcVar5,(ulong)uVar3);
LAB_0010d7b8:
  pcVar5 = strstr(c_postamble,buf);
  if (pcVar5 == (char *)0x0) {
    strcat(c_postamble,buf);
  }
  return;
}

Assistant:

static void
output_c_for_amode_ptr (const Token *t, BOOL reversed)
{
  int reg = t->u.amodeinfo.which & 7, mode = (t->u.amodeinfo.which >> 3) & 7;
  char buf[512];
  int size = t->u.amodeinfo.size;

  switch (mode) {
  case 0:
  case 1:
    fatal_error ("Internal error: called output_c_for_amode_ptr with "
		 "a register addressing mode!");
    break;

  case 2:
    fprintf (syn68k_c_stream, "(ADDRESS_REGISTER_UL (%d)) ", reg);
    break;

  case 3:
    fprintf (syn68k_c_stream, "(ADDRESS_REGISTER_UL (%d)) ", reg);

    /* Perform postincrement, but force sp to remain even! */
    if (size == 1 && reg != 7)
      sprintf (buf, "++ADDRESS_REGISTER_UL (%d); ", reg);
    else
      sprintf (buf, "INC_VAR (ADDRESS_REGISTER_UL (%d), %d); ", reg,
	       (reg != 7 || size != 1) ? size : 2);
    if (strstr (c_postamble, buf) == NULL)
      strcat (c_postamble, buf);
    break;
  case 4:
    fprintf (syn68k_c_stream, "(ADDRESS_REGISTER_UL (%d) - %d) ", reg,
	     (reg != 7 || size != 1) ? size : 2);

    /* Perform predecrement, but force sp to remain even! */
    if (size == 1 && reg != 7)
      sprintf (buf, "--ADDRESS_REGISTER_UL (%d); ", reg);
    else
      sprintf (buf, "DEC_VAR (ADDRESS_REGISTER_UL (%d), %d); ", reg,
	       (reg != 7 || size != 1) ? size : 2);
    if (strstr (c_postamble, buf) == NULL)
      strcat (c_postamble, buf);
    break;
  case 5:
    fatal_error ("Internal error: attempting to generate code for fixed "
		 "amode 5.  It should have been expanded and replaced with "
		 "explicit code to compute the pointer.\n");
    break;

    /* Modes 6 and 7 are too complicated to expand; a pointer to the data
     * will be placed in the appropriate place by the synthetic instruction
     * right before this one.
     */
  case 6:
  case 7:
    if (!reversed)
      fprintf (syn68k_c_stream, " (cpu_state.amode_p) ");
    else
      fprintf (syn68k_c_stream, " (cpu_state.reversed_amode_p) ");
    break;
  }
}